

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O1

string * __thiscall
vkt::ssbo::(anonymous_namespace)::genName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char first,char last,int ndx)

{
  int iVar1;
  undefined7 in_register_00000009;
  long lVar2;
  undefined7 in_register_00000011;
  int iVar3;
  
  lVar2 = CONCAT71(in_register_00000009,last);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  iVar1 = ((int)CONCAT71(in_register_00000011,first) - (int)this) + 1;
  iVar3 = (int)lVar2;
  while (iVar1 < iVar3) {
    lVar2 = (long)((int)lVar2 + -1) / (long)iVar1;
    std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
    iVar3 = (int)lVar2;
  }
  std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
  return __return_storage_ptr__;
}

Assistant:

static std::string genName (char first, char last, int ndx)
{
	std::string	str			= "";
	int			alphabetLen	= last - first + 1;

	while (ndx > alphabetLen)
	{
		str.insert(str.begin(), (char)(first + ((ndx-1)%alphabetLen)));
		ndx = ((ndx-1) / alphabetLen);
	}

	str.insert(str.begin(), (char)(first + (ndx%(alphabetLen+1)) - 1));

	return str;
}